

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::io::Printer::PrintImpl(std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::Span<std::__cxx11::string_const>,google::protobuf::io::Printer::PrintOptions)::__5,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  FormatSpec<char,_char,_std::basic_string_view<char>_> local_18;
  
  local_18.super_type.spec_.data_ = "annotation range was not closed; expected %c}%c: %s";
  local_18.super_type.spec_.size_ = 0x33;
  StrFormat<char,_char,_std::basic_string_view<char,_std::char_traits<char>_>_>
            (__return_storage_ptr__,&local_18,(char *)(*(long *)this + 0x28),
             (char *)(*(long *)this + 0x28),
             (basic_string_view<char,_std::char_traits<char>_> *)(this + 8));
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}